

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_entry_lite.h
# Opt level: O3

uint8_t * __thiscall
google::protobuf::internal::
MapEntryImpl<CoreML::Specification::MILSpec::Block_AttributesEntry_DoNotUse,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
::_InternalSerialize
          (MapEntryImpl<CoreML::Specification::MILSpec::Block_AttributesEntry_DoNotUse,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
           *this,uint8_t *ptr,EpsCopyOutputStream *stream)

{
  uint value;
  size_t __n;
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint8_t *puVar2;
  string *s;
  
  iVar1 = (*(this->super_MessageLite)._vptr_MessageLite[0xd])();
  s = (string *)CONCAT44(extraout_var,iVar1);
  if (stream->end_ <= ptr) {
    ptr = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,ptr);
  }
  __n = s->_M_string_length;
  if (((long)__n < 0x80) && ((long)__n <= (long)(stream->end_ + (0xe - (long)ptr)))) {
    *ptr = '\n';
    ptr[1] = (uint8_t)__n;
    memcpy(ptr + 2,(s->_M_dataplus)._M_p,__n);
    puVar2 = ptr + __n + 2;
  }
  else {
    puVar2 = io::EpsCopyOutputStream::WriteStringOutline(stream,1,s,ptr);
  }
  iVar1 = (*(this->super_MessageLite)._vptr_MessageLite[0xe])(this);
  if (stream->end_ <= puVar2) {
    puVar2 = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,puVar2);
  }
  *puVar2 = '\x12';
  value = (((Value *)CONCAT44(extraout_var_00,iVar1))->_cached_size_).size_.super___atomic_base<int>
          ._M_i;
  puVar2[1] = (uint8_t)value;
  if (value < 0x80) {
    puVar2 = puVar2 + 2;
  }
  else {
    puVar2 = io::CodedOutputStream::WriteVarint32ToArrayOutOfLineHelper(value,puVar2 + 1);
  }
  puVar2 = CoreML::Specification::MILSpec::Value::_InternalSerialize
                     ((Value *)CONCAT44(extraout_var_00,iVar1),puVar2,stream);
  return puVar2;
}

Assistant:

::uint8_t* _InternalSerialize(
      ::uint8_t* ptr, io::EpsCopyOutputStream* stream) const override {
    ptr = KeyTypeHandler::Write(kKeyFieldNumber, key(), ptr, stream);
    return ValueTypeHandler::Write(kValueFieldNumber, value(), ptr, stream);
  }